

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

char * openjtalk_getVoiceNameSjis(OpenJTalk *oj,char *path)

{
  char *pcVar1;
  char temp [260];
  char temp0 [260];
  char acStack_228 [272];
  char local_118 [264];
  
  if (oj == (OpenJTalk *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else {
    oj->errorCode = OPENJTALKERROR_NO_ERROR;
    if (oj->fn_voice_path[0] == '\0') {
      oj->errorCode = OPENJTALKERROR_PATH_STRING_IS_NULL_OR_EMPTY;
    }
    else {
      pcVar1 = u8tou8_path(oj->fn_voice_path,acStack_228);
      if (pcVar1 != (char *)0x0) {
        get_fname(acStack_228,local_118);
        pcVar1 = convert_charset_path(local_118,CS_UTF_8,path,CS_SHIFT_JIS);
        return pcVar1;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

OPENJTALK_DLL_API char *OPENJTALK_CONVENTION openjtalk_getVoicePath(OpenJTalk *oj, char *path)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return NULL;
	}

	if (!path)
	{
		oj->errorCode = OPENJTALKERROR_BUFFER_IS_NULL;
		return NULL;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	if (!oj->fn_voice_path || strlen(oj->fn_voice_path) == 0)
	{
		oj->errorCode = OPENJTALKERROR_PATH_STRING_IS_NULL_OR_EMPTY;
		return NULL;
	}
#if defined(_WIN32)
	char *res = u8tou8_path(oj->fn_voice_path, path);
#else
	char *res = u8tou8_path(oj->fn_voice_path, path);
#endif
	return res;
}